

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::SFML::Update(Vector2i *mousePos,Vector2f *displaySize,Time dt)

{
  bool bVar1;
  ImGuiIO *io_00;
  float fVar2;
  bool local_46;
  Button local_44;
  ImVec2 IStack_40;
  uint i;
  Vector2<int> local_38;
  Vector2i newMousePos;
  ImGuiIO *io;
  Vector2f *displaySize_local;
  Vector2i *mousePos_local;
  Time dt_local;
  
  mousePos_local = (Vector2i *)dt.m_microseconds;
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx && \"No current window is set - forgot to call ImGui::SFML::Init?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x1c3,
                  "void ImGui::SFML::Update(const sf::Vector2i &, const sf::Vector2f &, sf::Time)");
  }
  io_00 = GetIO();
  ImVec2::ImVec2((ImVec2 *)&newMousePos,displaySize->x,displaySize->y);
  (io_00->DisplaySize).x = (float)newMousePos.x;
  (io_00->DisplaySize).y = (float)newMousePos.y;
  fVar2 = sf::Time::asSeconds((Time *)&mousePos_local);
  io_00->DeltaTime = fVar2;
  if ((*(byte *)((anonymous_namespace)::s_currWindowCtx + 0x38) & 1) != 0) {
    if ((io_00->WantSetMousePos & 1U) == 0) {
      ImVec2::ImVec2(&stack0xffffffffffffffc0,(float)mousePos->x,(float)mousePos->y);
      io_00->MousePos = IStack_40;
    }
    else {
      sf::Vector2<int>::Vector2(&local_38,(int)(io_00->MousePos).x,(int)(io_00->MousePos).y);
      sf::Mouse::setPosition(&local_38);
    }
    for (local_44 = Left; local_44 < XButton1; local_44 = local_44 + Right) {
      local_46 = true;
      if ((*(byte *)((anonymous_namespace)::s_currWindowCtx + 0x44 + (ulong)local_44) & 1) == 0) {
        bVar1 = sf::Touch::isDown(local_44);
        local_46 = true;
        if ((!bVar1) &&
           (local_46 = true,
           (*(byte *)((anonymous_namespace)::s_currWindowCtx + 0x3a + (ulong)local_44) & 1) == 0)) {
          local_46 = sf::Mouse::isButtonPressed(local_44);
        }
      }
      io_00->MouseDown[local_44] = local_46;
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x3a + (ulong)local_44) = 0;
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x44 + (ulong)local_44) = 0;
    }
  }
  if (0 < (io_00->Fonts->Fonts).Size) {
    if (((io_00->ConfigFlags & 2U) != 0) &&
       (*(int *)((anonymous_namespace)::s_currWindowCtx + 0x50) != 8)) {
      anon_unknown.dwarf_f6bf2::updateJoystickActionState(io_00,ImGuiNavInput_Activate);
      anon_unknown.dwarf_f6bf2::updateJoystickActionState(io_00,ImGuiNavInput_Cancel);
      anon_unknown.dwarf_f6bf2::updateJoystickActionState(io_00,ImGuiNavInput_Input);
      anon_unknown.dwarf_f6bf2::updateJoystickActionState(io_00,ImGuiNavInput_Menu);
      anon_unknown.dwarf_f6bf2::updateJoystickActionState(io_00,ImGuiNavInput_FocusPrev);
      anon_unknown.dwarf_f6bf2::updateJoystickActionState(io_00,ImGuiNavInput_FocusNext);
      anon_unknown.dwarf_f6bf2::updateJoystickActionState(io_00,ImGuiNavInput_TweakSlow);
      anon_unknown.dwarf_f6bf2::updateJoystickActionState(io_00,ImGuiNavInput_TweakFast);
      anon_unknown.dwarf_f6bf2::updateJoystickDPadState(io_00);
      anon_unknown.dwarf_f6bf2::updateJoystickLStickState(io_00);
    }
    NewFrame();
    return;
  }
  __assert_fail("io.Fonts->Fonts.Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                ,0x1e8,
                "void ImGui::SFML::Update(const sf::Vector2i &, const sf::Vector2f &, sf::Time)");
}

Assistant:

void Update(const sf::Vector2i& mousePos, const sf::Vector2f& displaySize, sf::Time dt) {
    assert(s_currWindowCtx && "No current window is set - forgot to call ImGui::SFML::Init?");

    ImGuiIO& io = ImGui::GetIO();
    io.DisplaySize = ImVec2(displaySize.x, displaySize.y);
    io.DeltaTime = dt.asSeconds();

    if (s_currWindowCtx->windowHasFocus) {
        if (io.WantSetMousePos) {
            sf::Vector2i newMousePos(static_cast<int>(io.MousePos.x),
                                     static_cast<int>(io.MousePos.y));
            sf::Mouse::setPosition(newMousePos);
        } else {
            io.MousePos = ImVec2(static_cast<float>(mousePos.x), static_cast<float>(mousePos.y));
        }
        for (unsigned int i = 0; i < 3; i++) {
            io.MouseDown[i] = s_currWindowCtx->touchDown[i] || sf::Touch::isDown(i) ||
                              s_currWindowCtx->mousePressed[i] ||
                              sf::Mouse::isButtonPressed((sf::Mouse::Button)i);
            s_currWindowCtx->mousePressed[i] = false;
            s_currWindowCtx->touchDown[i] = false;
        }
    }

#ifdef ANDROID
#ifdef USE_JNI
    if (io.WantTextInput && !s_currWindowCtx->wantTextInput) {
        openKeyboardIME();
        s_currWindowCtx->wantTextInput = true;
    }

    if (!io.WantTextInput && s_currWindowCtx->wantTextInput) {
        closeKeyboardIME();
        s_currWindowCtx->wantTextInput = false;
    }
#endif
#endif

    assert(io.Fonts->Fonts.Size > 0); // You forgot to create and set up font
                                      // atlas (see createFontTexture)

    // gamepad navigation
    if ((io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) &&
        s_currWindowCtx->joystickId != NULL_JOYSTICK_ID) {
        updateJoystickActionState(io, ImGuiNavInput_Activate);
        updateJoystickActionState(io, ImGuiNavInput_Cancel);
        updateJoystickActionState(io, ImGuiNavInput_Input);
        updateJoystickActionState(io, ImGuiNavInput_Menu);

        updateJoystickActionState(io, ImGuiNavInput_FocusPrev);
        updateJoystickActionState(io, ImGuiNavInput_FocusNext);

        updateJoystickActionState(io, ImGuiNavInput_TweakSlow);
        updateJoystickActionState(io, ImGuiNavInput_TweakFast);

        updateJoystickDPadState(io);
        updateJoystickLStickState(io);
    }

    ImGui::NewFrame();
}